

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qsbr.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_25d63::QSBR_ReacquireLivePtrAfterQuiescentState_Test::TestBody
          (QSBR_ReacquireLivePtrAfterQuiescentState_Test *this)

{
  bool bVar1;
  reference pvVar2;
  reference lhs;
  char *message;
  void *pvVar3;
  AssertHelper local_68;
  Message local_60;
  char local_51;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  qsbr_ptr<char> active_ptr;
  thread local_28;
  qsbr_thread local_20;
  qsbr_thread second_thread;
  char *ptr;
  QSBR_ReacquireLivePtrAfterQuiescentState_Test *this_local;
  
  unodb::test::QSBRTestBase::mark_epoch(&this->super_QSBR);
  second_thread.super_thread._M_id._M_thread = (thread)unodb::test::QSBRTestBase::allocate();
  unodb::test::QSBRTestBase::touch_memory((char *)second_thread.super_thread._M_id._M_thread,'A');
  local_28._M_id._M_thread = (id)(id)second_thread.super_thread._M_id._M_thread;
  unodb::qsbr_thread::
  qsbr_thread<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_laurynas_biveinis[P]unodb_test_test_qsbr_cpp:805:36)>
            (&local_20,(type *)&local_28);
  pvVar3 = (void *)0x0;
  pvVar2 = std::array<unodb::detail::thread_sync,_6UL>::operator[]
                     ((array<unodb::detail::thread_sync,_6UL> *)unodb::detail::thread_syncs,0);
  unodb::detail::thread_sync::wait(pvVar2,pvVar3);
  unodb::test::QSBRTestBase::quiescent();
  unodb::test::QSBRTestBase::check_epoch_same(&this->super_QSBR);
  unodb::qsbr_ptr<char>::qsbr_ptr
            ((qsbr_ptr<char> *)&gtest_ar.message_,
             (pointer)second_thread.super_thread._M_id._M_thread);
  pvVar2 = std::array<unodb::detail::thread_sync,_6UL>::operator[]
                     ((array<unodb::detail::thread_sync,_6UL> *)unodb::detail::thread_syncs,1);
  unodb::detail::thread_sync::notify(pvVar2);
  pvVar3 = (void *)0x0;
  pvVar2 = std::array<unodb::detail::thread_sync,_6UL>::operator[]
                     ((array<unodb::detail::thread_sync,_6UL> *)unodb::detail::thread_syncs,0);
  unodb::detail::thread_sync::wait(pvVar2,pvVar3);
  unodb::test::QSBRTestBase::join(&local_20);
  unodb::test::QSBRTestBase::check_epoch_advanced(&this->super_QSBR);
  lhs = unodb::qsbr_ptr<char>::operator*((qsbr_ptr<char> *)&gtest_ar.message_);
  local_51 = 'A';
  testing::internal::EqHelper::Compare<char,_char,_nullptr>
            ((EqHelper *)local_50,"(*active_ptr)","(\'A\')",lhs,&local_51);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_qsbr.cpp"
               ,0x340,message);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  unodb::qsbr_ptr<char>::~qsbr_ptr((qsbr_ptr<char> *)&gtest_ar.message_);
  if (bVar1) {
    unodb::test::QSBRTestBase::quiescent();
    unodb::test::QSBRTestBase::check_epoch_advanced(&this->super_QSBR);
  }
  unodb::qsbr_thread::~qsbr_thread(&local_20);
  return;
}

Assistant:

UNODB_TEST_F(QSBR, ReacquireLivePtrAfterQuiescentState) {
  mark_epoch();
  auto *const ptr = static_cast<char *>(allocate());
  touch_memory(ptr, 'A');

  unodb::qsbr_thread second_thread{[ptr] {
    thread_syncs[0].notify();  // 1 ->
    thread_syncs[1].wait();    // 2 <-

    qsbr_deallocate(ptr);

    thread_syncs[0].notify();  // 3 ->
  }};

  thread_syncs[0].wait();  // 1 <-

  // Wrote ptr to a shared data structure and done with it for now
  quiescent();

  check_epoch_same();

  {
    // Reacquired ptr from a shared data structure
    const unodb::qsbr_ptr<char> active_ptr{ptr};

    thread_syncs[1].notify();  // 2 ->
    thread_syncs[0].wait();    // 3 <-

    join(second_thread);

    check_epoch_advanced();

    UNODB_ASSERT_EQ(*active_ptr, 'A');
  }

  quiescent();

  check_epoch_advanced();
}